

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc.c
# Opt level: O2

void sbox_s256_lowmc_192_192_4(mzd_local_t *in)

{
  undefined1 in_stack_00000008 [32];
  undefined1 in_stack_00000028 [32];
  undefined1 in_stack_00000048 [32];
  
  sbox_s256_lowmc_full
            (in,(word256)in_stack_00000008,(word256)in_stack_00000028,(word256)in_stack_00000048);
  return;
}

Assistant:

ATTR_TARGET_AVX2
static inline void sbox_s256_lowmc_192_192_4(mzd_local_t* in) {
  sbox_s256_lowmc_full(in,
                       mm256_set_4(MASK_192_192_64_A_0, MASK_192_192_64_A_1, MASK_192_192_64_A_2,
                                   MASK_192_192_64_A_3),
                       mm256_set_4(MASK_192_192_64_B_0, MASK_192_192_64_B_1, MASK_192_192_64_B_2,
                                   MASK_192_192_64_B_3),
                       mm256_set_4(MASK_192_192_64_C_0, MASK_192_192_64_C_1, MASK_192_192_64_C_2,
                                   MASK_192_192_64_C_3));
}